

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateAttributeValueInternal(xmlDocPtr doc,xmlAttributeType type,xmlChar *value)

{
  xmlChar *value_local;
  xmlAttributeType type_local;
  xmlDocPtr doc_local;
  
  switch(type) {
  case XML_ATTRIBUTE_CDATA:
  default:
    doc_local._4_4_ = 1;
    break;
  case XML_ATTRIBUTE_ID:
  case XML_ATTRIBUTE_IDREF:
  case XML_ATTRIBUTE_ENTITY:
  case XML_ATTRIBUTE_NOTATION:
    doc_local._4_4_ = xmlValidateNameValueInternal(doc,value);
    break;
  case XML_ATTRIBUTE_IDREFS:
  case XML_ATTRIBUTE_ENTITIES:
    doc_local._4_4_ = xmlValidateNamesValueInternal(doc,value);
    break;
  case XML_ATTRIBUTE_NMTOKEN:
    doc_local._4_4_ = xmlValidateNmtokenValueInternal(doc,value);
    break;
  case XML_ATTRIBUTE_NMTOKENS:
  case XML_ATTRIBUTE_ENUMERATION:
    doc_local._4_4_ = xmlValidateNmtokensValueInternal(doc,value);
  }
  return doc_local._4_4_;
}

Assistant:

static int
xmlValidateAttributeValueInternal(xmlDocPtr doc, xmlAttributeType type,
                                  const xmlChar *value) {
    switch (type) {
	case XML_ATTRIBUTE_ENTITIES:
	case XML_ATTRIBUTE_IDREFS:
	    return(xmlValidateNamesValueInternal(doc, value));
	case XML_ATTRIBUTE_ENTITY:
	case XML_ATTRIBUTE_IDREF:
	case XML_ATTRIBUTE_ID:
	case XML_ATTRIBUTE_NOTATION:
	    return(xmlValidateNameValueInternal(doc, value));
	case XML_ATTRIBUTE_NMTOKENS:
	case XML_ATTRIBUTE_ENUMERATION:
	    return(xmlValidateNmtokensValueInternal(doc, value));
	case XML_ATTRIBUTE_NMTOKEN:
	    return(xmlValidateNmtokenValueInternal(doc, value));
        case XML_ATTRIBUTE_CDATA:
	    break;
    }
    return(1);
}